

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O0

void __thiscall xray_re::xr_ogf_v3::xr_ogf_v3(xr_ogf_v3 *this)

{
  xr_ogf_v3 *this_local;
  
  xr_ogf::xr_ogf(&this->super_xr_ogf,OGF3_VERSION);
  (this->super_xr_ogf).super_xr_object.super_xr_surface_factory._vptr_xr_surface_factory =
       (_func_int **)&PTR__xr_ogf_v3_0038d1b8;
  this->m_vsplits = (ogf3_vsplit *)0x0;
  this->m_fix_faces = (uint16_t *)0x0;
  xr_ibuf::xr_ibuf(&this->m_ib0);
  this->m_ext_vb_index = 0;
  this->m_ext_vb_offset = 0;
  this->m_ext_vb_size = 0;
  std::__cxx11::string::string((string *)&this->m_source);
  std::__cxx11::string::string((string *)&this->m_export_tool);
  return;
}

Assistant:

xr_ogf_v3::xr_ogf_v3(): xr_ogf(OGF3_VERSION),
	m_vsplits(0), m_fix_faces(0),
	m_ext_vb_index(0), m_ext_vb_offset(0), m_ext_vb_size(0) {}